

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

int32_t internal_exr_compute_chunk_offset_size(_internal_exr_part *curpart)

{
  int iVar1;
  int iVar2;
  exr_attr_chlist_t *peVar3;
  exr_attr_tiledesc_t *peVar4;
  exr_attr_chlist_entry_t *peVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int16_t iVar11;
  ulong uVar12;
  uint64_t uVar13;
  
  peVar3 = (curpart->channels->field_6).chlist;
  if (curpart->tiles != (exr_attribute_t *)0x0) {
    peVar4 = (curpart->tiles->field_6).tiledesc;
    bVar7 = peVar4->level_and_round & 0xf;
    if (bVar7 < 2) {
      if (0 < (long)curpart->num_tile_levels_x) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          lVar9 = lVar9 + (long)curpart->tile_level_tile_count_y[lVar10] *
                          (long)curpart->tile_level_tile_count_x[lVar10];
          lVar10 = lVar10 + 1;
        } while (curpart->num_tile_levels_x != lVar10);
        if (0x7fffffff < lVar9) {
          return -1;
        }
        goto LAB_0011ca8c;
      }
    }
    else {
      if (bVar7 != 2) {
        return -1;
      }
      if (0 < (long)curpart->num_tile_levels_x) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          if (0 < curpart->num_tile_levels_y) {
            uVar12 = 0;
            do {
              lVar9 = (long)curpart->tile_level_tile_count_y[uVar12] *
                      (long)curpart->tile_level_tile_count_x[lVar10] + lVar9;
              if (0x7fffffff < lVar9) {
                return -1;
              }
              uVar12 = uVar12 + 1;
            } while ((uint)curpart->num_tile_levels_y != uVar12);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != curpart->num_tile_levels_x);
        goto LAB_0011ca8c;
      }
    }
    lVar9 = 0;
LAB_0011ca8c:
    if ((long)peVar3->num_channels < 1) {
      iVar11 = 0;
      uVar13 = 0;
    }
    else {
      peVar5 = peVar3->entries;
      lVar10 = 0;
      uVar13 = 0;
      iVar11 = 0;
      do {
        uVar12 = (ulong)*(int *)(peVar5->reserved + lVar10 + 7);
        if (uVar12 < 2) {
          uVar12 = (ulong)peVar4->y_size;
        }
        else {
          uVar12 = ((peVar4->y_size + uVar12) - 1) / uVar12;
          iVar11 = 1;
        }
        uVar13 = uVar13 + uVar12 * ((((long)*(int *)(peVar5->reserved + lVar10 + 3) +
                                     (ulong)peVar4->x_size) - 1) /
                                    (ulong)(long)*(int *)(peVar5->reserved + lVar10 + 3) <<
                                   (2U - (*(int *)(peVar5->reserved + lVar10 + -5) == 1) & 0x3f));
        lVar10 = lVar10 + 0x20;
      } while ((long)peVar3->num_channels * 0x20 != lVar10);
    }
    curpart->unpacked_size_per_chunk = uVar13;
    curpart->chan_has_line_sampling = iVar11;
    return (int32_t)lVar9;
  }
  switch(curpart->comp_type) {
  case EXR_COMPRESSION_NONE:
  case EXR_COMPRESSION_RLE:
  case EXR_COMPRESSION_ZIPS:
    uVar12 = 1;
    bVar6 = true;
    goto LAB_0011cb3b;
  case EXR_COMPRESSION_ZIP:
  case EXR_COMPRESSION_PXR24:
    uVar12 = 0x10;
    break;
  case EXR_COMPRESSION_PIZ:
  case EXR_COMPRESSION_B44:
  case EXR_COMPRESSION_B44A:
  case EXR_COMPRESSION_DWAA:
    uVar12 = 0x20;
    break;
  case EXR_COMPRESSION_DWAB:
    uVar12 = 0x100;
    break;
  default:
    return -1;
  }
  bVar6 = false;
LAB_0011cb3b:
  iVar1 = (curpart->data_window).min.field_0.field_0.y;
  iVar2 = (curpart->data_window).max.field_0.field_0.y;
  if ((long)peVar3->num_channels < 1) {
    iVar11 = 0;
    uVar13 = 0;
  }
  else {
    peVar5 = peVar3->entries;
    lVar9 = 0;
    uVar13 = 0;
    iVar11 = 0;
    do {
      uVar8 = (ulong)*(int *)(peVar5->reserved + lVar9 + 7);
      lVar10 = ((((long)(curpart->data_window).max.field_0.field_0.x -
                 (long)(curpart->data_window).min.field_0.field_0.x) + 1U) /
                (ulong)(long)*(int *)(peVar5->reserved + lVar9 + 3) <<
               (2U - (*(int *)(peVar5->reserved + lVar9 + -5) == 1) & 0x3f)) * uVar12;
      if (1 < uVar8) {
        iVar11 = 1;
      }
      if (1 < uVar8 && !bVar6) {
        lVar10 = lVar10 * (uVar12 / uVar8);
        iVar11 = 1;
      }
      uVar13 = uVar13 + lVar10;
      lVar9 = lVar9 + 0x20;
    } while ((long)peVar3->num_channels * 0x20 != lVar9);
  }
  curpart->unpacked_size_per_chunk = uVar13;
  curpart->lines_per_chunk = (int16_t)uVar12;
  curpart->chan_has_line_sampling = iVar11;
  return (int32_t)((((long)iVar2 - (long)iVar1) + uVar12) / uVar12);
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (struct _internal_exr_part* curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (((uint64_t) tiledesc->x_size + xsamp - 1) / xsamp);
            if (ysamp > 1)
            {
                hasLineSample = 1;
                cunpsz *= (((uint64_t) tiledesc->y_size + ysamp - 1) / ysamp);
            }
            else
                cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        uint64_t linePerChunk, h;
        switch (curpart->comp_type)
        {
            case EXR_COMPRESSION_NONE:
            case EXR_COMPRESSION_RLE:
            case EXR_COMPRESSION_ZIPS: linePerChunk = 1; break;
            case EXR_COMPRESSION_ZIP:
            case EXR_COMPRESSION_PXR24: linePerChunk = 16; break;
            case EXR_COMPRESSION_PIZ:
            case EXR_COMPRESSION_B44:
            case EXR_COMPRESSION_B44A:
            case EXR_COMPRESSION_DWAA: linePerChunk = 32; break;
            case EXR_COMPRESSION_DWAB: linePerChunk = 256; break;
            case EXR_COMPRESSION_LAST_TYPE:
            default:
                /* ERROR CONDITION */
                return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= w / xsamp;
            cunpsz *= linePerChunk;
            if (ysamp > 1)
            {
                hasLineSample = 1;
                if (linePerChunk > 1) cunpsz *= linePerChunk / ysamp;
            }
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->lines_per_chunk         = ((int16_t) linePerChunk);
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}